

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O3

void __thiscall soplex::SPxSteepPR<double>::entered4(SPxSteepPR<double> *this,SPxId param_1,int n)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  SPxSolverBase<double> *pSVar5;
  pointer pdVar6;
  UpdateVector<double> *pUVar7;
  pointer pdVar8;
  UpdateVector<double> *pUVar9;
  pointer pdVar10;
  pointer pdVar11;
  pointer pdVar12;
  SVSetBase<double> *pSVar13;
  Item *pIVar14;
  bool bVar15;
  uint uVar16;
  Nonzero<double> *pNVar17;
  long lVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  double dVar20;
  Real RVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  
  if ((-1 < n) &&
     (pSVar5 = (this->super_SPxPricer<double>).thesolver, n < (pSVar5->thecovectors->set).thenum)) {
    dVar25 = 1.0 / (double)(pSVar5->super_SPxBasisBase<double>).iterCount + 2.0;
    pdVar6 = (pSVar5->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pUVar7 = pSVar5->thePvec;
    pdVar8 = (pUVar7->thedelta).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pUVar9 = pSVar5->theCoPvec;
    dVar23 = 1.0 / (pSVar5->theFvec->thedelta).super_VectorBase<double>.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[(uint)n];
    lVar18 = (long)(pUVar9->thedelta).super_IdxSet.num;
    if (0 < lVar18) {
      pdVar10 = (pSVar5->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar11 = (this->workVec).super_VectorBase<double>.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pdVar12 = (pUVar9->thedelta).super_VectorBase<double>.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      dVar1 = *(double *)(in_FS_OFFSET + -8);
      uVar19 = lVar18 + 1;
      do {
        iVar2 = (pUVar9->thedelta).super_IdxSet.idx[uVar19 - 2];
        dVar20 = pdVar12[iVar2] * dVar23;
        dVar24 = pdVar11[iVar2];
        dVar20 = (this->pi_p * dVar20 - (dVar24 + dVar24)) * dVar20 + pdVar10[iVar2];
        pdVar10[iVar2] = dVar20;
        dVar24 = dVar25;
        if (dVar20 < dVar25) {
LAB_0020d683:
          pdVar10[iVar2] = dVar24;
        }
        else {
          ::soplex::infinity::__tls_init();
          if (dVar1 < dVar20) {
            RVar21 = Tolerances::epsilon((((this->super_SPxPricer<double>).thesolver)->
                                         super_SPxLPBase<double>)._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr);
            dVar24 = 1.0 / RVar21;
            goto LAB_0020d683;
          }
        }
        uVar19 = uVar19 - 1;
      } while (1 < uVar19);
    }
    lVar18 = (long)(pUVar7->thedelta).super_IdxSet.num;
    if (0 < lVar18) {
      dVar1 = *(double *)(in_FS_OFFSET + -8);
      do {
        iVar2 = (pUVar7->thedelta).super_IdxSet.idx[lVar18 + -1];
        pSVar13 = ((this->super_SPxPricer<double>).thesolver)->thevectors;
        pIVar14 = (pSVar13->set).theitem;
        iVar3 = (pSVar13->set).thekey[iVar2].idx;
        iVar4 = pIVar14[iVar3].data.super_SVectorBase<double>.memused;
        if (iVar4 < 1) {
          dVar24 = 0.0;
        }
        else {
          pNVar17 = pIVar14[iVar3].data.super_SVectorBase<double>.m_elem;
          uVar16 = iVar4 + 1;
          dVar20 = 0.0;
          dVar24 = 0.0;
          do {
            dVar26 = pNVar17->val *
                     (this->workVec).super_VectorBase<double>.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[pNVar17->idx];
            dVar22 = dVar24 + dVar26;
            dVar20 = dVar20 + (dVar26 - (dVar22 - dVar24)) + (dVar24 - (dVar22 - (dVar22 - dVar24)))
            ;
            pNVar17 = pNVar17 + 1;
            uVar16 = uVar16 - 1;
            dVar24 = dVar22;
          } while (1 < uVar16);
          dVar24 = dVar22 + dVar20 + dVar22 + dVar20;
        }
        dVar20 = pdVar8[iVar2] * dVar23;
        dVar20 = (this->pi_p * dVar20 - dVar24) * dVar20 + pdVar6[iVar2];
        pdVar6[iVar2] = dVar20;
        dVar24 = dVar25;
        if (dVar20 < dVar25) {
LAB_0020d7c6:
          pdVar6[iVar2] = dVar24;
        }
        else {
          ::soplex::infinity::__tls_init();
          if (dVar1 < dVar20) {
            RVar21 = Tolerances::epsilon((((this->super_SPxPricer<double>).thesolver)->
                                         super_SPxLPBase<double>)._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr);
            dVar24 = 1.0 / RVar21;
            goto LAB_0020d7c6;
          }
        }
        bVar15 = 1 < lVar18;
        lVar18 = lVar18 + -1;
      } while (bVar15);
    }
  }
  return;
}

Assistant:

void SPxSteepPR<R>::entered4(SPxId /* id */, int n)
{
   assert(this->thesolver->type() == SPxSolverBase<R>::ENTER);

   if(n >= 0 && n < this->thesolver->dim())
   {
      R delta = 2 + 1.0 / this->thesolver->basis().iteration();
      R* coWeights_ptr = this->thesolver->coWeights.get_ptr();
      R* weights_ptr = this->thesolver->weights.get_ptr();
      const R* workVec_ptr = workVec.get_const_ptr();
      const R* pVec = this->thesolver->pVec().delta().values();
      const IdxSet& pIdx = this->thesolver->pVec().idx();
      const R* coPvec = this->thesolver->coPvec().delta().values();
      const IdxSet& coPidx = this->thesolver->coPvec().idx();
      R xi_p = 1 / this->thesolver->fVec().delta()[n];
      int i, j;
      R xi_ip;

      assert(this->thesolver->fVec().delta()[n] > this->thesolver->epsilon()
             || this->thesolver->fVec().delta()[n] < -this->thesolver->epsilon());

      for(j = coPidx.size() - 1; j >= 0; --j)
      {
         i = coPidx.index(j);
         xi_ip = xi_p * coPvec[i];
         coWeights_ptr[i] += xi_ip * (xi_ip * pi_p - 2.0 * workVec_ptr[i]);

         /*
           if(coWeights_ptr[i] < 1)
           coWeights_ptr[i] = 1 / (2-x);
         */
         if(coWeights_ptr[i] < delta)
            coWeights_ptr[i] = delta;
         // coWeights_ptr[i] = 1;
         else if(coWeights_ptr[i] > R(infinity))
            coWeights_ptr[i] = 1 / this->thesolver->epsilon();
      }

      for(j = pIdx.size() - 1; j >= 0; --j)
      {
         i = pIdx.index(j);
         xi_ip = xi_p * pVec[i];
         weights_ptr[i] += xi_ip * (xi_ip * pi_p - 2.0 * (this->thesolver->vector(i) * workVec));

         /*
           if(weights_ptr[i] < 1)
           weights_ptr[i] = 1 / (2-x);
         */
         if(weights_ptr[i] < delta)
            weights_ptr[i] = delta;
         // weights_ptr[i] = 1;
         else if(weights_ptr[i] > R(infinity))
            weights_ptr[i] = 1.0 / this->thesolver->epsilon();
      }
   }

   /*@
     if(this->thesolver->isId(id))
     weights[   this->thesolver->number(id) ] *= 1.0001;
     else if(this->thesolver->isCoId(id))
     coWeights[ this->thesolver->number(id) ] *= 1.0001;
   */

}